

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derLEnc(octet *der,size_t len)

{
  size_t r;
  size_t l;
  size_t l_count;
  size_t len_local;
  octet *der_local;
  
  l_count = 1;
  l = len;
  if (0x7f < len) {
    for (; l != 0; l = l >> 8) {
      l_count = l_count + 1;
    }
  }
  if (der != (octet *)0x0) {
    if (len < 0x80) {
      *der = (octet)len;
    }
    else {
      *der = (byte)(l_count - 1) | 0x80;
      r = l_count - 1;
      len_local = len;
      while (r != 0) {
        der[r] = (octet)len_local;
        len_local = len_local >> 8;
        r = r - 1;
      }
    }
  }
  return l_count;
}

Assistant:

static size_t derLEnc(octet der[], size_t len)
{
	size_t l_count = 1;
	// определить длину кода
	{
		size_t l = len;
		// длинная форма (r | 128) || o_{r - 1} ||...|| o_0?
		if (l >= 128)
			for (; l; l >>= 8, ++l_count);
	}
	// кодировать
	if (der)
	{
		ASSERT(memIsValid(der, l_count));
		if (len < 128)
		{
			ASSERT(l_count == 1);
			der[0] = (octet)len;
		}
		else
		{
			size_t r = l_count - 1;
			ASSERT(r >= 1);
			der[0] = (octet)(r | 128);
			for (; r; der[r--] = (octet)len, len >>= 8);
			ASSERT(len == 0);
		}
	}
	return l_count;
}